

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_cobs_zpe.c
# Opt level: O2

int mpt_decode_cobs_zpe_r(mpt_decode_state *info,iovec *source,size_t sourcelen)

{
  int iVar1;
  size_t sVar2;
  mpt_message local_48;
  
  iVar1 = mpt_decode_cobs_zpe(info,source,sourcelen);
  if (iVar1 == -0x10) {
    if (info->_ctx == 0) {
      iVar1 = -0x10;
    }
    else {
      local_48.used = 0;
      local_48.base = (undefined1 *)0x0;
      local_48.cont = source;
      local_48.clen = sourcelen;
      mpt_message_read(&local_48,(info->data).len + (info->data).pos,(void *)0x0);
      if (local_48.used == 0) {
        iVar1 = -0x11;
      }
      else {
        *(char *)local_48.base = (char)info->_ctx;
        sVar2 = (info->data).len + 1;
        (info->data).len = sVar2;
        (info->data).msg = sVar2;
        info->_ctx = 0;
        info->curr = info->curr + 1;
        iVar1 = 1;
      }
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_decode_cobs_zpe_r(MPT_STRUCT(decode_state) *info, const struct iovec *source, size_t sourcelen)
{
	return _decode_r(info, source, sourcelen);
}